

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

int nni_url_parse_inline(nng_url *url,char *raw)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  char cVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  
  for (sVar8 = 0; raw[sVar8] != '\0'; sVar8 = sVar8 + 1) {
    if (raw[sVar8] == ':') {
      if ((raw[sVar8 + 1] == '/') && (raw[sVar8 + 2] == '/')) {
        pcVar12 = raw + sVar8;
        pcVar10 = "http";
        lVar11 = 0;
        goto LAB_00119133;
      }
      break;
    }
  }
  goto LAB_001192d7;
LAB_0011936e:
  if (*pcVar12 == 0) goto LAB_0011938b;
  if (*pcVar12 == 0x23) goto LAB_00119380;
  pcVar12 = pcVar12 + 1;
  goto LAB_0011936e;
LAB_00119380:
  *pcVar12 = 0;
  url->u_fragment = pcVar12 + 1;
  goto LAB_0011938b;
  while( true ) {
    pcVar10 = nni_schemes[lVar11 + 1];
    lVar11 = lVar11 + 1;
    if (lVar11 == 0x20) break;
LAB_00119133:
    iVar3 = strncmp(raw,pcVar10,sVar8);
    if (iVar3 == 0) {
      url->u_scheme = pcVar10;
      goto LAB_00119163;
    }
  }
  pcVar10 = url->u_scheme;
LAB_00119163:
  if (pcVar10 == (char *)0x0) {
    iVar3 = 9;
    goto LAB_001192dd;
  }
  sVar8 = strlen(pcVar12);
  if (sVar8 < 0x80) {
    pcVar10 = url->u_static;
    sVar9 = 0;
    snprintf(pcVar10,0x80,"%s",pcVar12);
    url->u_buffer = pcVar10;
  }
  else {
    pcVar10 = nni_strdup(pcVar12);
    url->u_buffer = pcVar10;
    sVar8 = strlen(pcVar12);
    sVar9 = sVar8 + 1;
  }
  url->u_bufsz = sVar9;
  pcVar10 = pcVar10 + 3;
  pcVar12 = url->u_scheme;
  iVar3 = strcmp(pcVar12,"ipc");
  if ((((iVar3 == 0) || (iVar3 = strcmp(pcVar12,"unix"), iVar3 == 0)) ||
      (iVar3 = strcmp(pcVar12,"abstract"), iVar3 == 0)) ||
     ((iVar3 = strcmp(pcVar12,"inproc"), iVar3 == 0 ||
      (iVar3 = strcmp(pcVar12,"socket"), pcVar12 = pcVar10, iVar3 == 0)))) {
    url->u_path = pcVar10;
    url->u_userinfo = (char *)0x0;
    url->u_hostname = (char *)0x0;
    url->u_query = (char *)0x0;
    url->u_fragment = (char *)0x0;
    return 0;
  }
  while( true ) {
    bVar1 = *pcVar12;
    if (((ulong)bVar1 < 0x40) && ((0x8000800800000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
    pcVar12 = pcVar12 + 1;
  }
  *pcVar12 = 0;
  pcVar5 = url->u_buffer;
  sVar8 = strlen(pcVar10);
  memmove(pcVar5,pcVar10,sVar8 + 1);
  *pcVar12 = bVar1;
  url->u_path = pcVar12;
  pcVar10 = url->u_buffer;
  url->u_hostname = pcVar10;
  pcVar5 = strchr(pcVar10,0x40);
  if (pcVar5 != (char *)0x0) {
    url->u_userinfo = pcVar10;
    pcVar10 = pcVar5 + 1;
    *pcVar5 = '\0';
    url->u_hostname = pcVar10;
    pcVar5 = strchr(pcVar10,0x40);
    if (pcVar5 != (char *)0x0) goto LAB_001192d7;
  }
  cVar7 = *pcVar10;
  if (cVar7 != '\0') {
    lVar11 = 1;
    pp_Var6 = __ctype_tolower_loc();
    do {
      *pcVar10 = (char)(*pp_Var6)[cVar7];
      cVar7 = url->u_hostname[lVar11];
      pcVar10 = url->u_hostname + lVar11;
      lVar11 = lVar11 + 1;
    } while (cVar7 != '\0');
  }
  iVar3 = nni_url_canonify_uri(pcVar12);
  if (iVar3 != 0) goto LAB_001192dd;
  for (; bVar1 = *pcVar12, bVar1 != 0; pcVar12 = pcVar12 + 1) {
    if (bVar1 == 0x23) goto LAB_00119380;
    if (bVar1 == 0x3f) {
      *pcVar12 = 0;
      pcVar12 = pcVar12 + 1;
      url->u_query = pcVar12;
      goto LAB_0011936e;
    }
  }
LAB_0011938b:
  pcVar12 = url->u_hostname;
  cVar7 = *pcVar12;
  if (cVar7 == '[') {
    url->u_hostname = pcVar12 + 1;
    pcVar12 = pcVar12 + 1;
    do {
      pcVar10 = pcVar12;
      if (*pcVar10 == '\0') goto LAB_001192d7;
      pcVar12 = pcVar10 + 1;
    } while (*pcVar10 != ']');
    *pcVar10 = '\0';
    cVar7 = *pcVar12;
    if ((cVar7 == '\0') || (cVar7 == ':')) goto LAB_001193c7;
  }
  else {
    while ((cVar7 != '\0' && (cVar7 != ':'))) {
      pcVar10 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
      cVar7 = *pcVar10;
    }
LAB_001193c7:
    if (cVar7 != ':') {
      sVar8 = strlen(url->u_hostname);
      iVar3 = 3;
      if (sVar8 < 0x100) {
        uVar2 = nni_url_default_port(url->u_scheme);
        url->u_port = (uint)uVar2;
        return 0;
      }
      goto LAB_001192dd;
    }
    *pcVar12 = '\0';
    sVar8 = strlen(url->u_hostname);
    if ((sVar8 < 0x100) && (pcVar12[1] != '\0')) {
      iVar4 = nni_get_port_by_name(pcVar12 + 1,&url->u_port);
      iVar3 = 3;
      if (iVar4 == 0) {
        return 0;
      }
      goto LAB_001192dd;
    }
  }
LAB_001192d7:
  iVar3 = 3;
LAB_001192dd:
  if (url->u_bufsz != 0) {
    nni_free(url->u_buffer,url->u_bufsz);
    url->u_buffer = (char *)0x0;
    url->u_bufsz = 0;
  }
  return iVar3;
}

Assistant:

int
nni_url_parse_inline(nng_url *url, const char *raw)
{
	int rv = nni_url_parse_inline_inner(url, raw);
	if (rv != 0) {
		nni_url_fini(url);
	}
	return (rv);
}